

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

void * mem_leak_operator_new_array(size_t size)

{
  MemoryLeakDetector *this;
  TestMemoryAllocator *allocator;
  char *pcVar1;
  undefined8 *puVar2;
  
  this = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewArrayAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory(this,allocator,size,false);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &std::__cxx11::istringstream::VTT;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

UT_THROW(std::bad_alloc)
{
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewArrayAllocator(), size);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}